

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O2

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar)

{
  int iVar1;
  int flag;
  int in_ECX;
  undefined8 uVar2;
  int w;
  int w_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  secp256k1_gej *in_R8;
  char *pcVar8;
  ulong uVar9;
  secp256k1_fe *psVar10;
  uint uVar11;
  bool bVar12;
  int mask;
  secp256k1_scalar q_lam;
  secp256k1_scalar q_1;
  secp256k1_ge tmpa;
  secp256k1_fe Z;
  secp256k1_fe neg_y;
  secp256k1_ge pre_a [4];
  secp256k1_ge pre_a_lam [4];
  int wnaf_1 [44];
  int wnaf_lam [44];
  
  iVar1 = secp256k1_ge_is_infinity(a);
  if (iVar1 != 0) {
    secp256k1_gej_set_infinity(r);
    return;
  }
  secp256k1_scalar_split_lambda(&q_1,&q_lam,scalar);
  iVar1 = secp256k1_wnaf_const(wnaf_1,&q_1,w,in_ECX);
  flag = secp256k1_wnaf_const(wnaf_lam,&q_lam,w_00,in_ECX);
  if (a->infinity == 0) {
    secp256k1_gej_set_ge(r,a);
    secp256k1_ecmult_odd_multiples_table((int)pre_a,pre_a_lam,&Z,&r->x,in_R8);
    secp256k1_ge_table_set_globalz(4,pre_a,&pre_a_lam[0].x);
    for (lVar7 = 0x30; lVar7 != 0x1d0; lVar7 = lVar7 + 0x68) {
      secp256k1_fe_normalize_weak((secp256k1_fe *)((long)pre_a[0].x.n + lVar7));
    }
    for (lVar7 = 0; lVar7 != 0x1a0; lVar7 = lVar7 + 0x68) {
      secp256k1_ge_mul_lambda
                ((secp256k1_ge *)((long)pre_a_lam[0].x.n + lVar7),
                 (secp256k1_ge *)((long)pre_a[0].x.n + lVar7));
    }
    if (wnaf_1[0x2b] == 0) {
      pcVar8 = "test condition failed: i != 0";
      uVar2 = 0xb2;
    }
    else {
      uVar5 = (wnaf_1[0x2b] >> 0x1f) + wnaf_1[0x2b] ^ wnaf_1[0x2b] >> 0x1f;
      if ((wnaf_1[0x2b] & 1U) == 0) {
        pcVar8 = "test condition failed: ((i) & 1) == 1";
      }
      else if (wnaf_1[0x2b] < -7) {
        pcVar8 = "test condition failed: (i) >= -((1 << ((4)-1)) - 1)";
      }
      else {
        if (wnaf_1[0x2b] < 8) {
          secp256k1_fe_clear(&tmpa.x);
          secp256k1_fe_clear(&tmpa.y);
          tmpa.x.n[4] = pre_a[0].x.n[4];
          tmpa.x.magnitude = pre_a[0].x.magnitude;
          tmpa.x.normalized = pre_a[0].x.normalized;
          tmpa.x.n[2] = pre_a[0].x.n[2];
          tmpa.x.n[3] = pre_a[0].x.n[3];
          tmpa.x.n[0] = pre_a[0].x.n[0];
          tmpa.x.n[1] = pre_a[0].x.n[1];
          tmpa.y.n[0] = pre_a[0].y.n[0];
          tmpa.y.n[1] = pre_a[0].y.n[1];
          tmpa.y.n[2] = pre_a[0].y.n[2];
          tmpa.y.n[3] = pre_a[0].y.n[3];
          tmpa.y.n[4] = pre_a[0].y.n[4];
          tmpa.y.magnitude = pre_a[0].y.magnitude;
          tmpa.y.normalized = pre_a[0].y.normalized;
          psVar10 = &pre_a[1].y;
          for (uVar9 = 1; uVar9 != 4; uVar9 = uVar9 + 1) {
            uVar3 = (uint)((uint)((int)uVar5 >> 1) == uVar9);
            secp256k1_fe_cmov(&tmpa.x,psVar10 + -1,uVar3);
            secp256k1_fe_cmov(&tmpa.y,psVar10,uVar3);
            psVar10 = (secp256k1_fe *)(psVar10[2].n + 1);
          }
          tmpa.infinity = 0;
          secp256k1_fe_negate_unchecked(&neg_y,&tmpa.y,1);
          secp256k1_fe_cmov(&tmpa.y,&neg_y,(uint)(wnaf_1[0x2b] != uVar5));
          secp256k1_gej_set_ge(r,&tmpa);
          if (wnaf_lam[0x2b] == 0) {
            pcVar8 = "test condition failed: i != 0";
            uVar2 = 0xb6;
          }
          else {
            uVar5 = (wnaf_lam[0x2b] >> 0x1f) + wnaf_lam[0x2b] ^ wnaf_lam[0x2b] >> 0x1f;
            if ((wnaf_lam[0x2b] & 1U) == 0) {
              pcVar8 = "test condition failed: ((i) & 1) == 1";
            }
            else if (wnaf_lam[0x2b] < -7) {
              pcVar8 = "test condition failed: (i) >= -((1 << ((4)-1)) - 1)";
            }
            else {
              if (wnaf_lam[0x2b] < 8) {
                secp256k1_fe_clear(&tmpa.x);
                secp256k1_fe_clear(&tmpa.y);
                tmpa.x.n[4] = pre_a_lam[0].x.n[4];
                tmpa.x.magnitude = pre_a_lam[0].x.magnitude;
                tmpa.x.normalized = pre_a_lam[0].x.normalized;
                tmpa.x.n[2] = pre_a_lam[0].x.n[2];
                tmpa.x.n[3] = pre_a_lam[0].x.n[3];
                tmpa.x.n[0] = pre_a_lam[0].x.n[0];
                tmpa.x.n[1] = pre_a_lam[0].x.n[1];
                tmpa.y.n[4] = pre_a_lam[0].y.n[4];
                tmpa.y.magnitude = pre_a_lam[0].y.magnitude;
                tmpa.y.normalized = pre_a_lam[0].y.normalized;
                tmpa.y.n[2] = pre_a_lam[0].y.n[2];
                tmpa.y.n[3] = pre_a_lam[0].y.n[3];
                tmpa.y.n[0] = pre_a_lam[0].y.n[0];
                tmpa.y.n[1] = pre_a_lam[0].y.n[1];
                psVar10 = &pre_a_lam[1].y;
                for (uVar9 = 1; uVar9 != 4; uVar9 = uVar9 + 1) {
                  uVar3 = (uint)((uint)((int)uVar5 >> 1) == uVar9);
                  secp256k1_fe_cmov(&tmpa.x,psVar10 + -1,uVar3);
                  secp256k1_fe_cmov(&tmpa.y,psVar10,uVar3);
                  psVar10 = (secp256k1_fe *)(psVar10[2].n + 1);
                }
                tmpa.infinity = 0;
                secp256k1_fe_negate_unchecked(&neg_y,&tmpa.y,1);
                secp256k1_fe_cmov(&tmpa.y,&neg_y,(uint)(wnaf_lam[0x2b] != uVar5));
                secp256k1_gej_add_ge(r,r,&tmpa);
                uVar5 = 0x2a;
                while( true ) {
                  if ((int)uVar5 < 0) {
                    secp256k1_ge_neg(&tmpa,pre_a);
                    secp256k1_gej_add_ge((secp256k1_gej *)&neg_y,r,&tmpa);
                    secp256k1_gej_cmov(r,(secp256k1_gej *)&neg_y,iVar1);
                    secp256k1_ge_neg(&tmpa,pre_a_lam);
                    secp256k1_gej_add_ge((secp256k1_gej *)&neg_y,r,&tmpa);
                    secp256k1_gej_cmov(r,(secp256k1_gej *)&neg_y,flag);
                    secp256k1_fe_mul(&r->z,&r->z,&Z);
                    return;
                  }
                  iVar6 = 3;
                  while (bVar12 = iVar6 != 0, iVar6 = iVar6 + -1, bVar12) {
                    secp256k1_gej_double(r,r);
                  }
                  uVar3 = wnaf_1[uVar5];
                  uVar11 = ((int)uVar3 >> 0x1f) + uVar3 ^ (int)uVar3 >> 0x1f;
                  if ((uVar3 & 1) == 0) break;
                  if ((int)uVar3 < -7) {
                    pcVar8 = "test condition failed: (n) >= -((1 << ((4)-1)) - 1)";
                    goto LAB_001071b5;
                  }
                  if (7 < (int)uVar3) {
                    pcVar8 = "test condition failed: (n) <= ((1 << ((4)-1)) - 1)";
                    goto LAB_001071b5;
                  }
                  secp256k1_fe_clear(&tmpa.x);
                  secp256k1_fe_clear(&tmpa.y);
                  tmpa.x.n[4] = pre_a[0].x.n[4];
                  tmpa.x.magnitude = pre_a[0].x.magnitude;
                  tmpa.x.normalized = pre_a[0].x.normalized;
                  tmpa.x.n[2] = pre_a[0].x.n[2];
                  tmpa.x.n[3] = pre_a[0].x.n[3];
                  tmpa.x.n[0] = pre_a[0].x.n[0];
                  tmpa.x.n[1] = pre_a[0].x.n[1];
                  tmpa.y.n[4] = pre_a[0].y.n[4];
                  tmpa.y.magnitude = pre_a[0].y.magnitude;
                  tmpa.y.normalized = pre_a[0].y.normalized;
                  tmpa.y.n[2] = pre_a[0].y.n[2];
                  tmpa.y.n[3] = pre_a[0].y.n[3];
                  tmpa.y.n[0] = pre_a[0].y.n[0];
                  tmpa.y.n[1] = pre_a[0].y.n[1];
                  psVar10 = &pre_a[1].y;
                  for (uVar9 = 1; uVar9 != 4; uVar9 = uVar9 + 1) {
                    uVar4 = (uint)((uint)((int)uVar11 >> 1) == uVar9);
                    secp256k1_fe_cmov(&tmpa.x,psVar10 + -1,uVar4);
                    secp256k1_fe_cmov(&tmpa.y,psVar10,uVar4);
                    psVar10 = (secp256k1_fe *)(psVar10[2].n + 1);
                  }
                  tmpa.infinity = 0;
                  secp256k1_fe_negate_unchecked(&neg_y,&tmpa.y,1);
                  secp256k1_fe_cmov(&tmpa.y,&neg_y,(uint)(uVar3 != uVar11));
                  if (uVar3 == 0) {
                    pcVar8 = "test condition failed: n != 0";
                    uVar2 = 0xc3;
                    goto LAB_00107274;
                  }
                  secp256k1_gej_add_ge(r,r,&tmpa);
                  uVar3 = wnaf_lam[uVar5];
                  uVar11 = ((int)uVar3 >> 0x1f) + uVar3 ^ (int)uVar3 >> 0x1f;
                  if ((uVar3 & 1) == 0) {
                    pcVar8 = "test condition failed: ((n) & 1) == 1";
LAB_00107249:
                    uVar2 = 0xc6;
                    goto LAB_00107274;
                  }
                  if ((int)uVar3 < -7) {
                    pcVar8 = "test condition failed: (n) >= -((1 << ((4)-1)) - 1)";
                    goto LAB_00107249;
                  }
                  if (7 < (int)uVar3) {
                    pcVar8 = "test condition failed: (n) <= ((1 << ((4)-1)) - 1)";
                    goto LAB_00107249;
                  }
                  secp256k1_fe_clear(&tmpa.x);
                  secp256k1_fe_clear(&tmpa.y);
                  tmpa.x.n[4] = pre_a_lam[0].x.n[4];
                  tmpa.x.magnitude = pre_a_lam[0].x.magnitude;
                  tmpa.x.normalized = pre_a_lam[0].x.normalized;
                  tmpa.x.n[2] = pre_a_lam[0].x.n[2];
                  tmpa.x.n[3] = pre_a_lam[0].x.n[3];
                  tmpa.x.n[0] = pre_a_lam[0].x.n[0];
                  tmpa.x.n[1] = pre_a_lam[0].x.n[1];
                  tmpa.y.n[4] = pre_a_lam[0].y.n[4];
                  tmpa.y.magnitude = pre_a_lam[0].y.magnitude;
                  tmpa.y.normalized = pre_a_lam[0].y.normalized;
                  tmpa.y.n[2] = pre_a_lam[0].y.n[2];
                  tmpa.y.n[3] = pre_a_lam[0].y.n[3];
                  tmpa.y.n[0] = pre_a_lam[0].y.n[0];
                  tmpa.y.n[1] = pre_a_lam[0].y.n[1];
                  psVar10 = &pre_a_lam[1].y;
                  for (uVar9 = 1; uVar9 != 4; uVar9 = uVar9 + 1) {
                    uVar4 = (uint)((uint)((int)uVar11 >> 1) == uVar9);
                    secp256k1_fe_cmov(&tmpa.x,psVar10 + -1,uVar4);
                    secp256k1_fe_cmov(&tmpa.y,psVar10,uVar4);
                    psVar10 = (secp256k1_fe *)(psVar10[2].n + 1);
                  }
                  tmpa.infinity = 0;
                  secp256k1_fe_negate_unchecked(&neg_y,&tmpa.y,1);
                  secp256k1_fe_cmov(&tmpa.y,&neg_y,(uint)(uVar3 != uVar11));
                  if (uVar3 == 0) {
                    pcVar8 = "test condition failed: n != 0";
                    uVar2 = 199;
                    goto LAB_00107274;
                  }
                  secp256k1_gej_add_ge(r,r,&tmpa);
                  uVar5 = uVar5 - 1;
                }
                pcVar8 = "test condition failed: ((n) & 1) == 1";
LAB_001071b5:
                uVar2 = 0xc2;
                goto LAB_00107274;
              }
              pcVar8 = "test condition failed: (i) <= ((1 << ((4)-1)) - 1)";
            }
            uVar2 = 0xb7;
          }
          goto LAB_00107274;
        }
        pcVar8 = "test condition failed: (i) <= ((1 << ((4)-1)) - 1)";
      }
      uVar2 = 0xb3;
    }
  }
  else {
    pcVar8 = "test condition failed: !a->infinity";
    uVar2 = 0xa4;
  }
LAB_00107274:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/ecmult_const_impl.h"
          ,uVar2,pcVar8);
  abort();
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;

    if (secp256k1_ge_is_infinity(a)) {
        secp256k1_gej_set_infinity(r);
        return;
    }

    /* build wnaf representation for q. */
    /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
    secp256k1_scalar_split_lambda(&q_1, &q_lam, scalar);
    skew_1   = secp256k1_wnaf_const(wnaf_1,   &q_1,   WINDOW_A - 1, 128);
    skew_lam = secp256k1_wnaf_const(wnaf_lam, &q_lam, WINDOW_A - 1, 128);

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    VERIFY_CHECK(!a->infinity);
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
    }

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(128, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
    i = wnaf_lam[WNAF_SIZE_BITS(128, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
    secp256k1_gej_add_ge(r, r, &tmpa);
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(128, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double(r, r);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
        n = wnaf_lam[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }

    {
        /* Correct for wNAF skew */
        secp256k1_gej tmpj;

        secp256k1_ge_neg(&tmpa, &pre_a[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_1);

        secp256k1_ge_neg(&tmpa, &pre_a_lam[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_lam);
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);
}